

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O3

void h2v2_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  uint uVar1;
  jpeg_upsampler *pjVar2;
  JSAMPLE *pJVar3;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var4;
  _func_void_j_decompress_ptr *p_Var5;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var6;
  long lVar7;
  JSAMPROW pJVar8;
  JSAMPROW pJVar9;
  ulong uVar10;
  long lVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  byte *pbVar16;
  long lVar17;
  byte *pbVar18;
  byte *pbVar19;
  long lVar20;
  
  pjVar2 = cinfo->upsample;
  pJVar3 = cinfo->sample_range_limit;
  p_Var4 = pjVar2[1].upsample;
  lVar14 = *(long *)&pjVar2[1].need_context_rows;
  p_Var5 = pjVar2[2].start_pass;
  p_Var6 = pjVar2[2].upsample;
  pbVar18 = (*input_buf)[in_row_group_ctr * 2];
  pbVar19 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
  pbVar16 = input_buf[1][in_row_group_ctr];
  pbVar12 = input_buf[2][in_row_group_ctr];
  pJVar9 = *output_buf;
  pJVar8 = output_buf[1];
  uVar1 = cinfo->output_width;
  if (1 < uVar1) {
    lVar20 = 0;
    lVar11 = 0;
    do {
      lVar15 = (long)*(int *)(p_Var4 + (ulong)pbVar12[lVar11] * 4);
      lVar17 = *(long *)(p_Var5 + (ulong)pbVar12[lVar11] * 8);
      lVar7 = *(long *)(p_Var6 + (ulong)pbVar16[lVar11] * 8);
      lVar13 = (long)*(int *)(lVar14 + (ulong)pbVar16[lVar11] * 4);
      uVar10 = (ulong)pbVar18[lVar11 * 2];
      *pJVar9 = pJVar3[lVar15 + uVar10];
      lVar17 = (long)(int)((ulong)(lVar17 + lVar7) >> 0x10);
      pJVar9[1] = pJVar3[uVar10 + lVar17];
      pJVar9[2] = pJVar3[uVar10 + lVar13];
      uVar10 = (ulong)pbVar18[lVar11 * 2 + 1];
      pJVar9[3] = pJVar3[lVar15 + uVar10];
      pJVar9[4] = pJVar3[uVar10 + lVar17];
      pJVar9[5] = pJVar3[uVar10 + lVar13];
      uVar10 = (ulong)pbVar19[lVar11 * 2];
      *pJVar8 = pJVar3[lVar15 + uVar10];
      pJVar8[1] = pJVar3[uVar10 + lVar17];
      pJVar8[2] = pJVar3[uVar10 + lVar13];
      uVar10 = (ulong)pbVar19[lVar11 * 2 + 1];
      pJVar8[3] = pJVar3[lVar15 + uVar10];
      pJVar8[4] = pJVar3[lVar17 + uVar10];
      pJVar8[5] = pJVar3[lVar13 + uVar10];
      pJVar9 = pJVar9 + 6;
      pJVar8 = pJVar8 + 6;
      lVar11 = lVar11 + 1;
      lVar20 = lVar20 + -2;
    } while (uVar1 >> 1 != (uint)lVar11);
    uVar1 = cinfo->output_width;
    pbVar12 = pbVar12 + lVar11;
    pbVar16 = pbVar16 + lVar11;
    pbVar19 = pbVar19 + -lVar20;
    pbVar18 = pbVar18 + -lVar20;
  }
  if ((uVar1 & 1) != 0) {
    lVar11 = *(long *)(p_Var5 + (ulong)*pbVar12 * 8);
    lVar20 = *(long *)(p_Var6 + (ulong)*pbVar16 * 8);
    lVar17 = (long)*(int *)(p_Var4 + (ulong)*pbVar12 * 4);
    lVar14 = (long)*(int *)(lVar14 + (ulong)*pbVar16 * 4);
    uVar10 = (ulong)*pbVar18;
    *pJVar9 = pJVar3[lVar17 + uVar10];
    lVar11 = (long)(int)((ulong)(lVar11 + lVar20) >> 0x10);
    pJVar9[1] = pJVar3[uVar10 + lVar11];
    pJVar9[2] = pJVar3[uVar10 + lVar14];
    uVar10 = (ulong)*pbVar19;
    *pJVar8 = pJVar3[lVar17 + uVar10];
    pJVar8[1] = pJVar3[lVar11 + uVar10];
    pJVar8[2] = pJVar3[lVar14 + uVar10];
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample (j_decompress_ptr cinfo,
		      JSAMPIMAGE input_buf, JDIMENSION in_row_group_ctr,
		      JSAMPARRAY output_buf)
{
  my_upsample_ptr upsample = (my_upsample_ptr) cinfo->upsample;
  register int y, cred, cgreen, cblue;
  int cb, cr;
  register JSAMPROW outptr0, outptr1;
  JSAMPROW inptr00, inptr01, inptr1, inptr2;
  JDIMENSION col;
  /* copy these pointers into registers if possible */
  register JSAMPLE * range_limit = cinfo->sample_range_limit;
  int * Crrtab = upsample->Cr_r_tab;
  int * Cbbtab = upsample->Cb_b_tab;
  INT32 * Crgtab = upsample->Cr_g_tab;
  INT32 * Cbgtab = upsample->Cb_g_tab;
  SHIFT_TEMPS

  inptr00 = input_buf[0][in_row_group_ctr*2];
  inptr01 = input_buf[0][in_row_group_ctr*2 + 1];
  inptr1 = input_buf[1][in_row_group_ctr];
  inptr2 = input_buf[2][in_row_group_ctr];
  outptr0 = output_buf[0];
  outptr1 = output_buf[1];
  /* Loop for each group of output pixels */
  for (col = cinfo->output_width >> 1; col > 0; col--) {
    /* Do the chroma part of the calculation */
    cb = GETJSAMPLE(*inptr1++);
    cr = GETJSAMPLE(*inptr2++);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    /* Fetch 4 Y values and emit 4 pixels */
    y  = GETJSAMPLE(*inptr00++);
    outptr0[RGB_RED] =   range_limit[y + cred];
    outptr0[RGB_GREEN] = range_limit[y + cgreen];
    outptr0[RGB_BLUE] =  range_limit[y + cblue];
    outptr0 += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr00++);
    outptr0[RGB_RED] =   range_limit[y + cred];
    outptr0[RGB_GREEN] = range_limit[y + cgreen];
    outptr0[RGB_BLUE] =  range_limit[y + cblue];
    outptr0 += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr01++);
    outptr1[RGB_RED] =   range_limit[y + cred];
    outptr1[RGB_GREEN] = range_limit[y + cgreen];
    outptr1[RGB_BLUE] =  range_limit[y + cblue];
    outptr1 += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr01++);
    outptr1[RGB_RED] =   range_limit[y + cred];
    outptr1[RGB_GREEN] = range_limit[y + cgreen];
    outptr1[RGB_BLUE] =  range_limit[y + cblue];
    outptr1 += RGB_PIXELSIZE;
  }
  /* If image width is odd, do the last output column separately */
  if (cinfo->output_width & 1) {
    cb = GETJSAMPLE(*inptr1);
    cr = GETJSAMPLE(*inptr2);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    y  = GETJSAMPLE(*inptr00);
    outptr0[RGB_RED] =   range_limit[y + cred];
    outptr0[RGB_GREEN] = range_limit[y + cgreen];
    outptr0[RGB_BLUE] =  range_limit[y + cblue];
    y  = GETJSAMPLE(*inptr01);
    outptr1[RGB_RED] =   range_limit[y + cred];
    outptr1[RGB_GREEN] = range_limit[y + cgreen];
    outptr1[RGB_BLUE] =  range_limit[y + cblue];
  }
}